

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock.h
# Opt level: O2

void __thiscall absl::base_internal::SpinLockHolder::~SpinLockHolder(SpinLockHolder *this)

{
  SpinLock::Unlock(this->lock_);
  return;
}

Assistant:

inline ~SpinLockHolder() ABSL_UNLOCK_FUNCTION() { lock_->Unlock(); }